

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

Abc_Obj_t * Abc_NtkFromBarBufs_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pFanin;
  long lVar1;
  
  if ((Abc_Obj_t *)(pObj->field_6).pTemp != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pObj->field_6).pTemp;
  }
  Abc_NtkDupObj(pNtkNew,pObj,0);
  if (0 < (pObj->vFanins).nSize) {
    lVar1 = 0;
    do {
      pObj_00 = (pObj->field_6).pCopy;
      pFanin = Abc_NtkFromBarBufs_rec
                         (pNtkNew,(Abc_Obj_t *)
                                  pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar1]]);
      Abc_ObjAddFanin(pObj_00,pFanin);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (pObj->vFanins).nSize);
  }
  return (Abc_Obj_t *)(pObj->field_6).pTemp;
}

Assistant:

Abc_Obj_t * Abc_NtkFromBarBufs_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin; 
    int i;
    if ( pObj->pCopy )
        return pObj->pCopy;
    Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_NtkFromBarBufs_rec(pNtkNew, pFanin) );
    return pObj->pCopy;
}